

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O3

void __thiscall APlayerPawn::BeginPlay(APlayerPawn *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  FString crouchspritename;
  FString normspritename;
  FString local_30;
  FString local_28;
  FString local_20;
  
  AActor::BeginPlay(&this->super_AActor);
  DThinker::ChangeStatNum((DThinker *)this,0x21);
  if (*(int *)&(this->super_AActor).field_0x4bc < 1) {
    return;
  }
  FString::FString(&local_20,(char *)(sprites.Array + ((this->super_AActor).SpawnState)->sprite));
  FString::FString(&local_28,(char *)(sprites.Array + *(int *)&(this->super_AActor).field_0x4bc));
  FString::operator+(&local_30,(char *)&local_20);
  iVar1 = FWadCollection::CheckNumForName(&Wads,local_30.Chars,1);
  FString::~FString(&local_30);
  if (iVar1 == -1) {
    FString::operator+(&local_30,(char *)&local_20);
    iVar1 = FWadCollection::CheckNumForName(&Wads,local_30.Chars,1);
    FString::~FString(&local_30);
  }
  FString::operator+(&local_30,(char *)&local_28);
  iVar2 = FWadCollection::CheckNumForName(&Wads,local_30.Chars,1);
  FString::~FString(&local_30);
  if (iVar2 == -1) {
    FString::operator+(&local_30,(char *)&local_28);
    iVar2 = FWadCollection::CheckNumForName(&Wads,local_30.Chars,1);
    FString::~FString(&local_30);
    bVar3 = iVar2 == -1;
  }
  else {
    bVar3 = false;
  }
  if ((iVar1 != -1) && (!bVar3)) {
    iVar2 = FWadCollection::GetLumpFile(&Wads,iVar1);
    iVar1 = FWadCollection::GetLumpFile(&Wads,iVar1);
    if ((iVar2 < 2) || (1 < iVar1)) goto LAB_00466b3a;
  }
  *(undefined4 *)&(this->super_AActor).field_0x4bc = 0;
LAB_00466b3a:
  FString::~FString(&local_28);
  FString::~FString(&local_20);
  return;
}

Assistant:

void APlayerPawn::BeginPlay ()
{
	Super::BeginPlay ();
	ChangeStatNum (STAT_PLAYER);

	// Check whether a PWADs normal sprite is to be combined with the base WADs
	// crouch sprite. In such a case the sprites normally don't match and it is
	// best to disable the crouch sprite.
	if (crouchsprite > 0)
	{
		// This assumes that player sprites always exist in rotated form and
		// that the front view is always a separate sprite. So far this is
		// true for anything that exists.
		FString normspritename = sprites[SpawnState->sprite].name;
		FString crouchspritename = sprites[crouchsprite].name;

		int spritenorm = Wads.CheckNumForName(normspritename + "A1", ns_sprites);
		if (spritenorm==-1) 
		{
			spritenorm = Wads.CheckNumForName(normspritename + "A0", ns_sprites);
		}

		int spritecrouch = Wads.CheckNumForName(crouchspritename + "A1", ns_sprites);
		if (spritecrouch==-1) 
		{
			spritecrouch = Wads.CheckNumForName(crouchspritename + "A0", ns_sprites);
		}
		
		if (spritenorm==-1 || spritecrouch ==-1) 
		{
			// Sprites do not exist so it is best to disable the crouch sprite.
			crouchsprite = 0;
			return;
		}
	
		int wadnorm = Wads.GetLumpFile(spritenorm);
		int wadcrouch = Wads.GetLumpFile(spritenorm);
		
		if (wadnorm > FWadCollection::IWAD_FILENUM && wadcrouch <= FWadCollection::IWAD_FILENUM) 
		{
			// Question: Add an option / disable crouching or do what?
			crouchsprite = 0;
		}
	}
}